

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O3

IntVect __thiscall amrex::BATransformer::coarsen_ratio(BATransformer *this)

{
  BATType BVar1;
  IntVect IVar2;
  
  BVar1 = this->m_bat_type;
  if (BVar1 < coarsenRatio) {
    IVar2.vect[2] = 1;
    IVar2.vect[0] = 1;
    IVar2.vect[1] = 1;
    return (IntVect)IVar2.vect;
  }
  if (BVar1 != indexType_coarsenRatio) {
    if (BVar1 == coarsenRatio) {
      return (IntVect)*(int (*) [3])&this->m_op;
    }
    return (IntVect)*&(this->m_op).m_bndryReg.m_crse_ratio.vect;
  }
  return (IntVect)*(int (*) [3])((long)&this->m_op + 4);
}

Assistant:

IntVect coarsen_ratio () const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.coarsen_ratio();
        case     BATType::indexType:
            return m_op.m_indexType.coarsen_ratio();
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.coarsen_ratio();
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.coarsen_ratio();
        default:
            return m_op.m_bndryReg.coarsen_ratio();
        }
    }